

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  long lVar1;
  undefined1 local_38 [8];
  uv_buf_t buf;
  uv_stream_t *stream;
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  buf.len = (size_t)(w[-3].watcher_queue + 1);
  if (((w[-3].fd != 0xc) && (w[-3].fd != 7)) && (w[-3].fd != 0xe)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/stream.c"
                  ,0x50e,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (((ulong)w[-1].pending_queue[0] & 1) != 0) {
    __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/stream.c"
                  ,0x50f,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  lVar1._0_4_ = w[-1].pevents;
  lVar1._4_4_ = w[-1].events;
  if (lVar1 == 0) {
    if (w->fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/stream.c"
                    ,0x516,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if ((events & 0x19) != 0) {
      uv__read((uv_stream_t *)buf.len);
    }
    if (*(int *)(buf.len + 0xb8) != -1) {
      if ((((events & 0x10) != 0) && ((*(uint *)(buf.len + 0x58) & 0x1000) != 0)) &&
         (((*(uint *)(buf.len + 0x58) & 0x400) != 0 && ((*(uint *)(buf.len + 0x58) & 0x800) == 0))))
      {
        memset(local_38,0,0x10);
        uv__stream_eof((uv_stream_t *)buf.len,(uv_buf_t *)local_38);
      }
      if ((*(int *)(buf.len + 0xb8) != -1) && ((events & 0x1c) != 0)) {
        uv__write((uv_stream_t *)buf.len);
        uv__write_callbacks((uv_stream_t *)buf.len);
        if (buf.len + 0xc0 == *(long *)(buf.len + 0xc0)) {
          uv__drain((uv_stream_t *)buf.len);
        }
      }
    }
  }
  else {
    uv__stream_connect((uv_stream_t *)buf.len);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even if it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_HANDLE_READING) &&
      (stream->flags & UV_HANDLE_READ_PARTIAL) &&
      !(stream->flags & UV_HANDLE_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}